

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanLt(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  XML_Convert_Result XVar4;
  byte *pbVar5;
  char *pcVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  unsigned_short *in_R8;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[1])(enc,ptr,end,(char **)ptr);
    if (iVar3 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    pcVar6 = extraout_RDX;
    goto LAB_00a27977;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[2])(enc,ptr,end,(char **)ptr);
    if (iVar3 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    pcVar6 = extraout_RDX_00;
    goto LAB_00a27977;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)ptr);
    if (iVar3 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    pcVar6 = extraout_RDX_01;
    goto LAB_00a27977;
  default:
    *nextTokPtr = ptr;
    enc_local._4_4_ = 0;
    break;
  case 0xf:
    enc_local._4_4_ = normal_scanPi(enc,ptr + 1,end,nextTokPtr);
    break;
  case 0x10:
    pbVar5 = (byte *)(ptr + 1);
    if ((long)end - (long)pbVar5 < 1) {
      enc_local._4_4_ = -1;
    }
    else {
      cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar5);
      if (cVar1 == '\x14') {
        enc_local._4_4_ = normal_scanCdataSection(enc,ptr + 2,end,nextTokPtr);
      }
      else if (cVar1 == '\x1b') {
        enc_local._4_4_ = normal_scanComment(enc,ptr + 2,end,nextTokPtr);
      }
      else {
        *nextTokPtr = (char *)pbVar5;
        enc_local._4_4_ = 0;
      }
    }
    break;
  case 0x11:
    enc_local._4_4_ = normal_scanEndTag(enc,ptr + 1,end,nextTokPtr);
    break;
  case 0x16:
  case 0x18:
    end_local = ptr + 1;
    pcVar6 = end;
LAB_00a27977:
    while (0 < (long)end - (long)end_local) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        XVar4 = (*enc[2].utf16Convert)
                          (enc,(char **)end_local,pcVar6,(unsigned_short **)end_local,in_R8);
        if (XVar4 == XML_CONVERT_COMPLETED) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 2;
        pcVar6 = extraout_RDX_02;
        break;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        iVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,end_local);
        if (iVar3 == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 3;
        pcVar6 = extraout_RDX_03;
        break;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[0])(enc,end_local,pcVar6,(char **)end_local);
        if (iVar3 == 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        end_local = end_local + 4;
        pcVar6 = extraout_RDX_04;
        break;
      default:
        *nextTokPtr = end_local;
        return 0;
      case 9:
      case 10:
      case 0x15:
        pcVar2 = end_local;
        goto LAB_00a27b16;
      case 0xb:
        goto LAB_00a27cfd;
      case 0x11:
        goto LAB_00a27d1a;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        end_local = end_local + 1;
        break;
      case 0x1d:
        *nextTokPtr = end_local;
        return 0;
      }
    }
    enc_local._4_4_ = -1;
    break;
  case 0x1d:
    *nextTokPtr = ptr;
    enc_local._4_4_ = 0;
  }
  return enc_local._4_4_;
switchD_00a27b62_caseD_9:
  pcVar2 = end_local;
LAB_00a27b16:
  end_local = pcVar2 + 1;
  if ((long)end - (long)end_local < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
  case 5:
    if ((long)end - (long)end_local < 2) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[1])(enc,end_local,pcVar6,(char **)end_local);
    if (iVar3 == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
    end_local = pcVar2 + 3;
    break;
  case 6:
    if ((long)end - (long)end_local < 3) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[2])(enc,end_local,pcVar6,(char **)end_local);
    if (iVar3 == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
    end_local = pcVar2 + 4;
    break;
  case 7:
    if ((long)end - (long)end_local < 4) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[0])(enc,end_local,pcVar6,(char **)end_local);
    if (iVar3 == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
    end_local = pcVar2 + 5;
    break;
  default:
    *nextTokPtr = end_local;
    return 0;
  case 9:
  case 10:
  case 0x15:
    goto switchD_00a27b62_caseD_9;
  case 0xb:
LAB_00a27cfd:
    *nextTokPtr = end_local + 1;
    return 2;
  case 0x11:
LAB_00a27d1a:
    pcVar6 = end_local + 1;
    if ((long)end - (long)pcVar6 < 1) {
      return -1;
    }
    if (*pcVar6 != '>') {
      *nextTokPtr = pcVar6;
      return 0;
    }
    *nextTokPtr = end_local + 2;
    return 4;
  case 0x16:
  case 0x18:
    end_local = pcVar2 + 2;
    break;
  case 0x1d:
    *nextTokPtr = end_local;
    return 0;
  }
  iVar3 = normal_scanAtts(enc,end_local,end,nextTokPtr);
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(scanLt)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon;
#endif
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_EXCL:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_MINUS:
      return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_LSQB:
      return PREFIX(scanCdataSection)(enc, ptr + MINBPC(enc),
                                      end, nextTokPtr);
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_QUEST:
    return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_SOL:
    return PREFIX(scanEndTag)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
#ifdef XML_NS
  hadColon = 0;
#endif
  /* we have a start-tag */
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      {
        ptr += MINBPC(enc);
        while (HAS_CHAR(enc, ptr, end)) {
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_GT:
            goto gt;
          case BT_SOL:
            goto sol;
          case BT_S: case BT_CR: case BT_LF:
            ptr += MINBPC(enc);
            continue;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          return PREFIX(scanAtts)(enc, ptr, end, nextTokPtr);
        }
        return XML_TOK_PARTIAL;
      }
    case BT_GT:
    gt:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_START_TAG_NO_ATTS;
    case BT_SOL:
    sol:
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_EMPTY_ELEMENT_NO_ATTS;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}